

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O3

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_stock_directory *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  uint6 uVar3;
  const_iterator cVar4;
  iterator iVar5;
  undefined8 uVar6;
  __hashtable *__h;
  ulong uVar7;
  ulong uVar8;
  string sym;
  order_book ob;
  key_type local_238;
  string local_218;
  order_book local_1f8;
  pair<const_unsigned_long,_helix::order_book> local_118;
  
  paVar1 = &local_238.field_2;
  local_238.field_2._M_allocated_capacity = *(undefined8 *)m->Stock;
  local_238._M_string_length = 8;
  local_238.field_2._M_local_buf[8] = '\0';
  local_238._M_dataplus._M_p = (pointer)paVar1;
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->_symbols)._M_t,&local_238);
  if ((_Rb_tree_header *)cVar4._M_node != &(this->_symbols)._M_t._M_impl.super__Rb_tree_header) {
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,local_238._M_dataplus._M_p,
               local_238._M_dataplus._M_p + local_238._M_string_length);
    uVar2 = *(ushort *)&m->field_0x9;
    uVar3 = *(uint6 *)&m->field_0x5;
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->_symbol_max_orders)._M_h,&local_238);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar6 = std::__throw_out_of_range("_Map_base::at");
      std::pair<const_unsigned_long,_helix::order_book>::~pair(&local_118);
      order_book::~order_book(&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar6);
    }
    uVar7 = (ulong)uVar2 << 0x20;
    uVar8 = (ulong)uVar3;
    order_book::order_book
              (&local_1f8,&local_218,
               ((uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
               uVar8 << 0x38) >> 0x10,
               *(size_t *)
                ((long)iVar5.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                       ._M_cur + 0x28));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::pair<const_unsigned_long,_helix::order_book>::
    pair<const_unsigned_short_&,_helix::order_book,_true>(&local_118,&m->StockLocate,&local_1f8);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,helix::order_book>,std::allocator<std::pair<unsigned_long_const,helix::order_book>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_long_const,helix::order_book>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,helix::order_book>,std::allocator<std::pair<unsigned_long_const,helix::order_book>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->order_book_id_map,&local_118);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_helix::price_level>,_std::_Select1st<std::pair<const_unsigned_long,_helix::price_level>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
    ::~_Rb_tree(&local_118.second._asks._M_t);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_helix::price_level>,_std::_Select1st<std::pair<const_unsigned_long,_helix::price_level>_>,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
    ::~_Rb_tree(&local_118.second._bids._M_t);
    boost::multi_index::
    multi_index_container<helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>
    ::~multi_index_container(&local_118.second._orders);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.second._symbol._M_dataplus._M_p != &local_118.second._symbol.field_2) {
      operator_delete(local_118.second._symbol._M_dataplus._M_p,
                      local_118.second._symbol.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_helix::price_level>,_std::_Select1st<std::pair<const_unsigned_long,_helix::price_level>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
    ::~_Rb_tree(&local_1f8._asks._M_t);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_helix::price_level>,_std::_Select1st<std::pair<const_unsigned_long,_helix::price_level>_>,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
    ::~_Rb_tree(&local_1f8._bids._M_t);
    boost::multi_index::
    multi_index_container<helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>
    ::~multi_index_container(&local_1f8._orders);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._symbol._M_dataplus._M_p != &local_1f8._symbol.field_2) {
      operator_delete(local_1f8._symbol._M_dataplus._M_p,
                      local_1f8._symbol.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_stock_directory* m)
{
    std::string sym{m->Stock, ITCH_SYMBOL_LEN};
    if (_symbols.count(sym) > 0) {
        order_book ob{sym, itch50_timestamp(m->Timestamp), _symbol_max_orders.at(sym)};
        order_book_id_map.insert({m->StockLocate, std::move(ob)});
    }
}